

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_template_generator.c
# Opt level: O1

operator_type_t
pi_template_lookup_symbol
          (pi_template_generator_t *ptg_context,char *begin_tag,dino_string_ptr result_buffer,
          _Bool *response_result)

{
  dino_intmap_t *map;
  _Bool _Var1;
  operator_type_t oVar2;
  char *pcVar3;
  dino_string_ptr symbol_buffer;
  dino_string_ptr dino_string;
  char *local_40;
  char *end_tag;
  
  if (result_buffer == (dino_string_ptr)0x0 || response_result == (_Bool *)0x0) {
    log_message(1,"pi_template_lookup_symbol",
                "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/lib/dino_template_generator.c"
                ,0xc3,"Assert Fired");
  }
  if ((*begin_tag != '<') || (begin_tag[1] != '%')) {
    log_message(1,"pi_template_lookup_symbol",
                "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/lib/dino_template_generator.c"
                ,0xc4,"Assert Fired");
  }
  if (result_buffer != (dino_string_ptr)0x0) {
    dino_string_reset(result_buffer);
  }
  if (response_result != (_Bool *)0x0) {
    *response_result = false;
  }
  oVar2 = operator_type_invalid;
  if ((*begin_tag == '<') && (oVar2 = operator_type_invalid, begin_tag[1] == '%')) {
    local_40 = (char *)0x0;
    end_tag = (char *)pi_template_get_symbol(begin_tag + 2,&local_40);
    map = ptg_context->symbol_map;
    pcVar3 = dino_string_c_ptr((dino_string_ptr)end_tag);
    oVar2 = intmap_get_value(map,pcVar3);
    dino_string = (dino_string_ptr)end_tag;
    switch(oVar2) {
    case operator_type_variable:
      _Var1 = pi_template_resolve_symbol(ptg_context,(dino_string_ptr)end_tag,result_buffer);
      oVar2 = (operator_type_t)_Var1;
      symbol_buffer = (dino_string_ptr)0x0;
      break;
    case operator_type_If:
      symbol_buffer = pi_template_get_symbol(local_40,&local_40);
      _Var1 = pi_template_test_symbol(ptg_context,symbol_buffer,response_result);
      oVar2 = (uint)_Var1 * 2;
      dino_string = (dino_string_ptr)end_tag;
      break;
    case operator_type_Else:
    case operator_type_EndIf:
      symbol_buffer = (dino_string_ptr)0x0;
      break;
    case operator_type_output:
      symbol_buffer = pi_template_get_symbol(local_40,&local_40);
      _Var1 = pi_template_resolve_symbol(ptg_context,symbol_buffer,result_buffer);
      oVar2 = (uint)_Var1 + (uint)_Var1 * 4;
      dino_string = (dino_string_ptr)end_tag;
      break;
    default:
      pcVar3 = dino_string_c_ptr((dino_string_ptr)end_tag);
      symbol_buffer = (dino_string_ptr)0x0;
      log_message(2,"pi_template_lookup_symbol",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/lib/dino_template_generator.c"
                  ,0xf6,"Unknown symbol or operator: %s",pcVar3);
    }
    dino_string_delete(dino_string,true);
    dino_string_delete(symbol_buffer,true);
  }
  return oVar2;
}

Assistant:

operator_type_t pi_template_lookup_symbol(pi_template_generator_t *ptg_context,
                                          const char *begin_tag,
                                          dino_string_ptr result_buffer,
                                          bool *response_result) {
    ASSERT(result_buffer != NULL && response_result != NULL);
    ASSERT(*begin_tag == '<' && *(begin_tag + 1) == '%');

    if (result_buffer) {
        dino_string_reset(result_buffer);
    }

    if (response_result) {
        *response_result = false;
    }

    operator_type_t operator_type = operator_type_invalid;

    if (*begin_tag == '<' && *(begin_tag + 1) == '%') {
        //  Move past the '<%' tag marker and any leading white spaces.
        //
        char *end_tag = NULL;
        dino_string_ptr first_symbol = pi_template_get_symbol(begin_tag + 2, &end_tag);

        operator_type = (operator_type_t) intmap_get_value(ptg_context->symbol_map,
                                                           dino_string_c_ptr(first_symbol));

        dino_string_ptr second_symbol = NULL;

        switch (operator_type) {
            case operator_type_If:
                second_symbol = pi_template_get_symbol(end_tag, &end_tag);
                if (!pi_template_test_symbol(ptg_context, second_symbol, response_result)) {
                    operator_type = operator_type_invalid;
                }
                break;

            case operator_type_Else:
            case operator_type_EndIf:
                break;

            case operator_type_output:
                second_symbol = pi_template_get_symbol(end_tag, &end_tag);
                if (!pi_template_resolve_symbol(ptg_context, second_symbol, result_buffer)) {
                    operator_type = operator_type_invalid;
                }
                break;

            case operator_type_variable:
                if (!pi_template_resolve_symbol(ptg_context, first_symbol, result_buffer)) {
                    operator_type = operator_type_invalid;
                }
                break;

            case operator_type_invalid:
            default:
                ERROR_LOG("Unknown symbol or operator: %s", dino_string_c_ptr(first_symbol));
                break;

        }

        dino_string_delete(first_symbol, true);
        dino_string_delete(second_symbol, true);
    }

    return operator_type;
}